

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

boolean jt_read_integer(char **strptr,JDIMENSION *result)

{
  char *pcVar1;
  ushort **ppuVar2;
  int *in_RSI;
  undefined8 *in_RDI;
  JDIMENSION val;
  char *ptr;
  int local_24;
  char *local_20;
  uint local_4;
  
  local_20 = (char *)*in_RDI;
  local_24 = 0;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_20] & 0x800) != 0) {
    local_24 = local_24 * 10 + *local_20 + -0x30;
    local_20 = local_20 + 1;
  }
  *in_RSI = local_24;
  pcVar1 = (char *)*in_RDI;
  if (local_20 != pcVar1) {
    *in_RDI = local_20;
  }
  local_4 = (uint)(local_20 != pcVar1);
  return local_4;
}

Assistant:

LOCAL(boolean)
jt_read_integer(const char **strptr, JDIMENSION *result)
{
  const char *ptr = *strptr;
  JDIMENSION val = 0;

  for (; isdigit(*ptr); ptr++) {
    val = val * 10 + (JDIMENSION)(*ptr - '0');
  }
  *result = val;
  if (ptr == *strptr)
    return FALSE;               /* oops, no digits */
  *strptr = ptr;
  return TRUE;
}